

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_stswi(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t val;
  TCGv_i64 EA;
  TCGv_i32 arg3;
  TCGv_i32 arg4;
  uint32_t local_34;
  int nb;
  TCGv_i32 t2;
  TCGv_i32 t1;
  TCGv_i64 t0;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  local_34 = NB(ctx->opcode);
  if ((ctx->le_mode & 1U) == 0) {
    gen_set_access_type(ctx,0x20);
    EA = tcg_temp_new_i64(tcg_ctx_00);
    gen_addr_register(ctx,EA);
    if (local_34 == 0) {
      local_34 = 0x20;
    }
    arg3 = tcg_const_i32_ppc64(tcg_ctx_00,local_34);
    val = rS(ctx->opcode);
    arg4 = tcg_const_i32_ppc64(tcg_ctx_00,val);
    gen_helper_stsw(tcg_ctx_00,tcg_ctx_00->cpu_env,EA,arg3,arg4);
    tcg_temp_free_i64(tcg_ctx_00,EA);
    tcg_temp_free_i32(tcg_ctx_00,arg3);
    tcg_temp_free_i32(tcg_ctx_00,arg4);
  }
  else {
    gen_align_no_le(ctx);
  }
  return;
}

Assistant:

static void gen_stswi(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;
    TCGv_i32 t1, t2;
    int nb = NB(ctx->opcode);

    if (ctx->le_mode) {
        gen_align_no_le(ctx);
        return;
    }
    gen_set_access_type(ctx, ACCESS_INT);
    t0 = tcg_temp_new(tcg_ctx);
    gen_addr_register(ctx, t0);
    if (nb == 0) {
        nb = 32;
    }
    t1 = tcg_const_i32(tcg_ctx, nb);
    t2 = tcg_const_i32(tcg_ctx, rS(ctx->opcode));
    gen_helper_stsw(tcg_ctx, tcg_ctx->cpu_env, t0, t1, t2);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free_i32(tcg_ctx, t1);
    tcg_temp_free_i32(tcg_ctx, t2);
}